

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O2

void testMultiPartSharedAttributes(string *tempDir)

{
  pointer pHVar1;
  pointer pHVar2;
  uint uVar3;
  Header *pHVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  char *pcVar8;
  int *piVar9;
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  *__x;
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  float *pfVar11;
  Attribute *pAVar12;
  int iVar13;
  size_t i;
  ulong uVar14;
  long lVar15;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> headers;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> headers_1;
  Header header;
  int iStack_2d4;
  TimeCodeAttribute tta;
  long local_298;
  ChromaticitiesAttribute cca;
  int iStack_27c;
  string fn;
  TimeCodeAttribute ta;
  TimeCode t;
  TimeCodeAttribute ta_1;
  vector<Imf_3_4::TypedAttribute<float>,_std::allocator<Imf_3_4::TypedAttribute<float>_>_> ifa;
  TimeCode t_1;
  stringstream ss;
  undefined1 local_1a8 [376];
  
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "Testing multi part APIs : shared attributes, header... ");
  std::endl<char,std::char_traits<char>>(poVar7);
  random_reseed(1);
  std::operator+(&fn,tempDir,"imf_test_multipart_shared_attrs.exr");
  headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::clear(&headers);
  for (iVar13 = 0; iVar13 != 3; iVar13 = iVar13 + 1) {
    _ss = (pointer)0x0;
    Imf_3_4::Header::Header(&header,0xc5,0x107,1.0,(Vec2 *)&ss,1.0,INCREASING_Y,ZIP_COMPRESSION);
    iVar5 = random_int(3);
    iVar6 = random_int(2);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1a8,iVar13);
    std::__cxx11::stringbuf::str();
    Imf_3_4::Header::setName((string *)&header);
    std::__cxx11::string::~string((string *)&cca);
    if (iVar5 == 0) {
      pcVar8 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&cca,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar8,(Channel *)"UINT");
    }
    else if (iVar5 == 1) {
      pcVar8 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&cca,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar8,(Channel *)"FLOAT");
    }
    else if (iVar5 == 2) {
      pcVar8 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&cca,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar8,(Channel *)"HALF");
    }
    if (iVar6 == 1) {
      Imf_3_4::Header::setType((string *)&header);
      iVar5 = random_int(0xc5);
      iVar6 = random_int(0x107);
      random_int(3);
      iStack_27c = iVar6 + 1;
      _cca = iVar5 + 1;
      Imf_3_4::Header::setTileDescription((TileDescription *)&header);
    }
    else if (iVar6 == 0) {
      Imf_3_4::Header::setType((string *)&header);
    }
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
              (&headers,(value_type *)&header);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    Imf_3_4::Header::~Header(&header);
  }
  remove(fn._M_dataplus._M_p);
  pHVar2 = headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pHVar1 = headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar13 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
            ((MultiPartOutputFile *)&ss,fn._M_dataplus._M_p,pHVar1,
             (int)(((long)pHVar2 - (long)pHVar1) / 0x38),false,iVar13);
  Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)&ss);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector(&headers_1,&headers);
  pcVar8 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&ss,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar8,(Channel *)"Dummy");
  piVar9 = (int *)Imf_3_4::Header::displayWindow();
  iVar5 = (piVar9[3] - piVar9[1]) + 10;
  iVar13 = (piVar9[2] - *piVar9) + 10;
  if (piVar9[3] < piVar9[1] || piVar9[2] < *piVar9) {
    iVar5 = 10;
    iVar13 = 10;
  }
  _header = 0;
  iStack_2d4 = 0;
  Imf_3_4::Header::Header
            ((Header *)&ss,iVar13,iVar5,1.0,(Vec2 *)&header,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_3_4::Header::type_abi_cxx11_();
  Imf_3_4::Header::setType((string *)&ss);
  __x = (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
         *)Imf_3_4::Header::channels();
  this = (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
          *)Imf_3_4::Header::channels();
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  ::operator=(this,__x);
  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            Imf_3_4::Header::name_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cca,"_newHeader",(allocator<char> *)&ta);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&header,
                 pbVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cca);
  Imf_3_4::Header::setName((string *)&ss);
  std::__cxx11::string::~string((string *)&header);
  std::__cxx11::string::~string((string *)&cca);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            (&headers_1,(value_type *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&header,"Shared Attributes : displayWindow : should fail for !=values",
             (allocator<char> *)&cca);
  anon_unknown.dwarf_1ce641::testMultiPartOutputFileForExpectedFailure
            (&headers_1,&fn,(string *)&header);
  std::__cxx11::string::~string((string *)&header);
  Imf_3_4::Header::~Header((Header *)&ss);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&headers_1);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector(&headers_1,&headers);
  Imf_3_4::Header::displayWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size((Box<Imath_3_2::Vec2<int>_> *)&header);
  uVar3 = _header;
  Imf_3_4::Header::displayWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size((Box<Imath_3_2::Vec2<int>_> *)&cca);
  iVar13 = iStack_27c;
  pfVar11 = (float *)Imf_3_4::Header::pixelAspectRatio();
  _ta = (pointer)0x0;
  Imf_3_4::Header::Header
            ((Header *)&ss,uVar3 + 1,iVar13 + 1,*pfVar11 + 1.0,(Vec2 *)&ta,1.0,INCREASING_Y,
             ZIP_COMPRESSION);
  Imf_3_4::Header::type_abi_cxx11_();
  Imf_3_4::Header::setType((string *)&ss);
  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            Imf_3_4::Header::name_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cca,"_newHeader",(allocator<char> *)&ta);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&header,
                 pbVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cca);
  Imf_3_4::Header::setName((string *)&ss);
  std::__cxx11::string::~string((string *)&header);
  std::__cxx11::string::~string((string *)&cca);
  pcVar8 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&header,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar8,(Channel *)"Dummy");
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            (&headers_1,(value_type *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&header,"Shared Attributes : pixelAspecRatio : should fail for !=values",
             (allocator<char> *)&cca);
  anon_unknown.dwarf_1ce641::testMultiPartOutputFileForExpectedFailure
            (&headers_1,&fn,(string *)&header);
  std::__cxx11::string::~string((string *)&header);
  Imf_3_4::Header::~Header((Header *)&ss);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&headers_1);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector(&headers_1,&headers);
  Imf_3_4::Header::Header
            ((Header *)&ss,
             headers_1.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl
             .super__Vector_impl_data._M_start);
  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            Imf_3_4::Header::name_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cca,"_newHeader",(allocator<char> *)&ta);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&header,
                 pbVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cca);
  Imf_3_4::Header::setName((string *)&ss);
  std::__cxx11::string::~string((string *)&header);
  std::__cxx11::string::~string((string *)&cca);
  pcVar8 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&header,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar8,(Channel *)"Dummy");
  Imf_3_4::TimeCode::TimeCode(&t,0x12d687,0,TV60_PACKING);
  Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::TypedAttribute((TimeCode *)&ta);
  pAVar12 = (Attribute *)Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::staticTypeName();
  Imf_3_4::Header::insert((char *)&ss,pAVar12);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            (&headers_1,(value_type *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&header,"Shared Attributes : timecode : should fail for !presence",
             (allocator<char> *)&cca);
  anon_unknown.dwarf_1ce641::testMultiPartOutputFileForExpectedFailure
            (&headers_1,&fn,(string *)&header);
  std::__cxx11::string::~string((string *)&header);
  lVar15 = 0;
  for (uVar14 = 0;
      pHVar1 = headers_1.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar14 < (ulong)(((long)headers_1.
                              super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)headers_1.
                             super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x38); uVar14 = uVar14 + 1)
  {
    pAVar12 = (Attribute *)Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::staticTypeName();
    Imf_3_4::Header::insert((char *)(pHVar1 + lVar15),pAVar12);
    lVar15 = lVar15 + 0x38;
  }
  iVar13 = Imf_3_4::TimeCode::timeAndFlags((Packing)&t);
  Imf_3_4::TimeCode::setTimeAndFlags((uint)&t,iVar13 + TV50_PACKING);
  Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::TypedAttribute((TimeCode *)&tta);
  pAVar12 = (Attribute *)Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::staticTypeName();
  Imf_3_4::Header::insert((char *)&ss,pAVar12);
  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            Imf_3_4::Header::name_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>((string *)&cca,"_+1",(allocator<char> *)&ifa);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&header,
                 pbVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cca);
  Imf_3_4::Header::setName((string *)&ss);
  std::__cxx11::string::~string((string *)&header);
  std::__cxx11::string::~string((string *)&cca);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            (&headers_1,(value_type *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&header,"Shared Attributes : timecode : should fail for != values",
             (allocator<char> *)&cca);
  anon_unknown.dwarf_1ce641::testMultiPartOutputFileForExpectedFailure
            (&headers_1,&fn,(string *)&header);
  std::__cxx11::string::~string((string *)&header);
  Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::~TypedAttribute(&tta);
  Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::~TypedAttribute(&ta);
  Imf_3_4::Header::~Header((Header *)&ss);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&headers_1);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&tta,&headers);
  Imf_3_4::Header::Header((Header *)&ss,_tta);
  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            Imf_3_4::Header::name_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cca,"_newHeader",(allocator<char> *)&headers_1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&header,
                 pbVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cca);
  Imf_3_4::Header::setName((string *)&ss);
  std::__cxx11::string::~string((string *)&header);
  std::__cxx11::string::~string((string *)&cca);
  pcVar8 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&header,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar8,(Channel *)"Dummy");
  _header = 0x3f23d70a;
  iStack_2d4 = 0x3ea8f5c3;
  _cca = 0x3e99999a;
  iStack_27c = 0x3f19999a;
  _ta = (pointer)0x3d75c28f3e19999a;
  _t = 0x3ea872b03ea01a37;
  Imf_3_4::Chromaticities::Chromaticities
            ((Chromaticities *)&headers_1,(Vec2 *)&header,(Vec2 *)&cca,(Vec2 *)&ta,(Vec2 *)&t);
  Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::TypedAttribute((Chromaticities *)&header);
  pAVar12 = (Attribute *)Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::staticTypeName();
  Imf_3_4::Header::insert((char *)&ss,pAVar12);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&tta,(value_type *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cca,"Shared Attributes : chromaticities : should fail for !present",
             (allocator<char> *)&ta);
  anon_unknown.dwarf_1ce641::testMultiPartOutputFileForExpectedFailure
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&tta,&fn,(string *)&cca);
  std::__cxx11::string::~string((string *)&cca);
  lVar15 = 0;
  for (uVar14 = 0; pHVar4 = _tta, uVar14 < (ulong)((local_298 - (long)_tta) / 0x38);
      uVar14 = uVar14 + 1) {
    pAVar12 = (Attribute *)Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::staticTypeName();
    Imf_3_4::Header::insert((char *)(pHVar4 + lVar15),pAVar12);
    lVar15 = lVar15 + 0x38;
  }
  headers_1.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44((float)((ulong)headers_1.
                                        super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 0x20) + 1.0,
                         SUB84(headers_1.
                               super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                               ._M_impl.super__Vector_impl_data._M_start,0) + 1.0);
  Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::TypedAttribute((Chromaticities *)&cca);
  pAVar12 = (Attribute *)Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::staticTypeName();
  Imf_3_4::Header::insert((char *)&ss,pAVar12);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&tta,(value_type *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ta,"Shared Attributes : chromaticities : should fail for != values",
             (allocator<char> *)&t);
  anon_unknown.dwarf_1ce641::testMultiPartOutputFileForExpectedFailure
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&tta,&fn,(string *)&ta);
  std::__cxx11::string::~string((string *)&ta);
  Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::~TypedAttribute(&cca);
  Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::~TypedAttribute
            ((TypedAttribute<Imf_3_4::Chromaticities> *)&header);
  Imf_3_4::Header::~Header((Header *)&ss);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&tta);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&headers);
  headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"Header : empty header list passed",(allocator<char> *)&header);
  anon_unknown.dwarf_1ce641::testMultiPartOutputFileForExpectedFailure(&headers,&fn,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  _ss = (pointer)0x0;
  Imf_3_4::Header::Header(&header,0x40,0x40,1.0,(Vec2 *)&ss,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar8 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&ss,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar8,(Channel *)"Dummy");
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back(&headers,&header);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"Header : empty image type passed",(allocator<char> *)&cca);
  anon_unknown.dwarf_1ce641::testMultiPartOutputFileForExpectedFailure(&headers,&fn,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  Imf_3_4::Header::setType
            ((string *)
             headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
             super__Vector_impl_data._M_start);
  Imf_3_4::Header::Header
            ((Header *)&cca,
             headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            (&headers,(value_type *)&cca);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"Header: duplicate header names passed",(allocator<char> *)&headers_1);
  anon_unknown.dwarf_1ce641::testMultiPartOutputFileForExpectedFailure(&headers,&fn,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  pHVar1 = headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"invalid image type",(allocator<char> *)&headers_1);
  Imf_3_4::Header::setType((string *)pHVar1);
  std::__cxx11::string::~string((string *)&ss);
  poVar7 = std::operator<<((ostream *)&std::cerr,"Header : unsupported image type passed");
  std::endl<char,std::char_traits<char>>(poVar7);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartSharedAttributes.cpp"
                ,0x15e,"void (anonymous namespace)::testHeaders(const std::string &)");
}

Assistant:

void
testMultiPartSharedAttributes (const std::string& tempDir)
{
    try
    {
        cout << "Testing multi part APIs : shared attributes, header... "
             << endl;

        random_reseed (1);

        std::string fn = tempDir + "imf_test_multipart_shared_attrs.exr";

        testSharedAttributes (fn);
        testHeaders (fn);

        cout << " ... ok\n" << endl;
    }
    catch (const IEX_NAMESPACE::BaseExc& e)
    {
        cerr << "ERROR -- caught IEX_NAMESPACE::BaseExc exception: "
             << e.what () << endl;
        assert (false);
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught std::exception exception: " << e.what ()
             << endl;
        assert (false);
    }
}